

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall QSocks5SocketEnginePrivate::emitWriteNotification(QSocks5SocketEnginePrivate *this)

{
  QObject *obj;
  
  obj = *(QObject **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  this->writeNotificationActivated = true;
  if ((this->writeNotificationEnabled == true) && (this->writeNotificationPending == false)) {
    this->writeNotificationPending = true;
    QMetaObject::invokeMethod<>(obj,"_q_emitPendingWriteNotification",QueuedConnection);
    return;
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::emitWriteNotification()
{
    Q_Q(QSocks5SocketEngine);
    writeNotificationActivated = true;
    if (writeNotificationEnabled && !writeNotificationPending) {
        QSOCKS5_D_DEBUG << "queueing writeNotification";
        writeNotificationPending = true;
        QMetaObject::invokeMethod(q, "_q_emitPendingWriteNotification", Qt::QueuedConnection);
    }
}